

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_winzip_aes_decode.c
# Opt level: O1

void winzip_aes_free(winzip_aes_conflict *ctx)

{
  char *__s;
  size_t __n;
  
  if (ctx != (winzip_aes_conflict *)0x0) {
    __s = ctx->password;
    __n = strlen(__s);
    memset(__s,0,__n);
    free(ctx->password);
    zip_error_fini(&ctx->error);
    _zip_buffer_free(ctx->buffer);
    _zip_winzip_aes_free(ctx->aes_ctx);
    free(ctx);
    return;
  }
  return;
}

Assistant:

static void
winzip_aes_free(struct winzip_aes *ctx) {
    if (ctx == NULL) {
        return;
    }

    _zip_crypto_clear(ctx->password, strlen(ctx->password));
    free(ctx->password);
    zip_error_fini(&ctx->error);
    _zip_winzip_aes_free(ctx->aes_ctx);
    free(ctx);
}